

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O0

boolean clear_fcorr(monst *grd,boolean forceshow)

{
  int iVar1;
  boolean bVar2;
  int x;
  int y;
  monst *local_38;
  monst *mtmp;
  int fcbeg;
  int fcy;
  int fcx;
  boolean forceshow_local;
  monst *grd_local;
  
  bVar2 = on_level((d_level *)((long)&grd[1].data + 4),&u.uz);
  fcy._3_1_ = forceshow;
  if (bVar2 != '\0') {
    while (iVar1 = *(int *)&grd->field_0x74, iVar1 < *(int *)&grd[1].nmon) {
      x = (int)*(char *)((long)grd[1].mtrack + (long)iVar1 * 3 + -0x34);
      y = (int)*(char *)((long)grd[1].mtrack + (long)iVar1 * 3 + -0x33);
      if (((grd->mhp < 1) || (bVar2 = in_fcorridor(grd,(int)u.ux,(int)u.uy), bVar2 == '\0')) &&
         (((ulong)grd[1].data & 0x100000000000000) != 0)) {
        fcy._3_1_ = '\x01';
      }
      if (((((u.ux == x) && (u.uy == y)) && (0 < grd->mhp)) ||
          ((fcy._3_1_ == '\0' && ((viz_array[y][x] & 1U) != 0)))) ||
         ((uball != (obj *)0x0 &&
          (((uball->where != '\x03' && (uball->ox == x)) && (uball->oy == y)))))) {
        return '\0';
      }
      if ((level->monsters[x][y] == (monst *)0x0) ||
         ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
        local_38 = (monst *)0x0;
      }
      else {
        local_38 = level->monsters[x][y];
      }
      if (local_38 != (monst *)0x0) {
        if ((*(uint *)&local_38->field_0x60 >> 0x1b & 1) != 0) {
          return '\0';
        }
        bVar2 = in_fcorridor(grd,(int)u.ux,(int)u.uy);
        if (bVar2 == '\0') {
          if (local_38->mtame != '\0') {
            yelp(local_38);
          }
          rloc(level,local_38,'\0');
        }
      }
      level->locations[x][y].typ = *(schar *)((long)grd[1].mtrack + (long)iVar1 * 3 + -0x32);
      map_location(x,y,1);
      if (level->locations[x][y].typ < '\x17') {
        block_point(x,y);
      }
      *(int *)&grd->field_0x74 = *(int *)&grd->field_0x74 + 1;
    }
    if ((grd->mhp < 1) &&
       (pline("The corridor disappears."), level->locations[u.ux][u.uy].typ < '\x11')) {
      pline("You are encased in rock.");
    }
  }
  return '\x01';
}

Assistant:

static boolean clear_fcorr(struct monst *grd, boolean forceshow)
{
	int fcx, fcy, fcbeg;
	struct monst *mtmp;

	if (!on_level(&(EGD(grd)->gdlevel), &u.uz)) return TRUE;

	while ((fcbeg = EGD(grd)->fcbeg) < EGD(grd)->fcend) {
		fcx = EGD(grd)->fakecorr[fcbeg].fx;
		fcy = EGD(grd)->fakecorr[fcbeg].fy;
		if ((grd->mhp <= 0 || !in_fcorridor(grd, u.ux, u.uy)) &&
				   EGD(grd)->gddone)
			forceshow = TRUE;
		if ((u.ux == fcx && u.uy == fcy && grd->mhp > 0)
			|| (!forceshow && couldsee(fcx,fcy))
			|| (Punished && !carried(uball)
				&& uball->ox == fcx && uball->oy == fcy))
			return FALSE;

		if ((mtmp = m_at(level, fcx,fcy)) != 0) {
			if (mtmp->isgd) return FALSE;
			else if (!in_fcorridor(grd, u.ux, u.uy)) {
			    if (mtmp->mtame) yelp(mtmp);
			    rloc(level, mtmp, FALSE);
			}
		}
		level->locations[fcx][fcy].typ = EGD(grd)->fakecorr[fcbeg].ftyp;
		map_location(fcx, fcy, 1);	/* bypass vision */
		if (!ACCESSIBLE(level->locations[fcx][fcy].typ)) block_point(fcx,fcy);
		EGD(grd)->fcbeg++;
	}
	if (grd->mhp <= 0) {
	    pline("The corridor disappears.");
	    if (IS_ROCK(level->locations[u.ux][u.uy].typ)) pline("You are encased in rock.");
	}
	return TRUE;
}